

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O0

trobj * copy_trobj_list(trobj *list)

{
  trobj *__dest;
  bool bVar1;
  int local_1c;
  int len;
  trobj *copy;
  trobj *list_local;
  
  local_1c = 0;
  while( true ) {
    bVar1 = true;
    if (list[local_1c].trotyp == 0) {
      bVar1 = list[local_1c].trclass != '\0';
    }
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  __dest = (trobj *)malloc((long)(local_1c + 1) << 3);
  memcpy(__dest,list,(long)(local_1c + 1) << 3);
  return __dest;
}

Assistant:

static struct trobj *copy_trobj_list(const struct trobj *list)
{
	struct trobj *copy;
	int len = 0;
	
	while (list[len].trotyp || list[len].trclass)
	    len++;
	len++; /* list is terminated by an entry of zeros */
	copy = malloc(len * sizeof(struct trobj));
	memcpy(copy, list, len * sizeof(struct trobj));
	
	return copy;
}